

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

void ncnn::copy_cut_border_image<signed_char>(Mat *src,Mat *dst,int top,int left)

{
  uint uVar1;
  int x;
  ulong uVar2;
  ulong uVar3;
  void *__dest;
  int iVar4;
  int iVar5;
  void *__src;
  
  uVar1 = dst->w;
  iVar5 = dst->h;
  __src = (void *)((long)src->data + (long)left + (long)top * (long)src->w * src->elemsize);
  iVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  __dest = dst->data;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar4 != iVar5; iVar4 = iVar4 + 1) {
    if ((int)uVar1 < 0xc) {
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        *(undefined1 *)((long)__dest + uVar2) = *(undefined1 *)((long)__src + uVar2);
      }
    }
    else {
      memcpy(__dest,__src,(long)(int)uVar1);
    }
    __dest = (void *)((long)__dest + (long)(int)uVar1);
    __src = (void *)((long)__src + (long)src->w);
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src.row<T>(top) + left;
    T* outptr = dst;//.data;

    for (int y = 0; y < h; y++)
    {
        if(w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w*sizeof(T));
        }
        outptr += w;
        ptr += src.w;
    }
}